

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::SetErrorMessage(string *msg,char **err)

{
  char *pcVar1;
  undefined8 *in_RSI;
  
  if (in_RSI != (undefined8 *)0x0) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar1 = strdup(pcVar1);
    *in_RSI = pcVar1;
  }
  return;
}

Assistant:

static void SetErrorMessage(const std::string &msg, const char **err) {
  if (err) {
#ifdef _WIN32
    (*err) = _strdup(msg.c_str());
#else
    (*err) = strdup(msg.c_str());
#endif
  }
}